

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintC::pushPrototypeInputs(PrintC *this,FuncProto *proto)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  allocator local_7d;
  uint local_7c;
  string local_78;
  Atom local_58;
  long *plVar3;
  
  uVar1 = (*proto->store->_vptr_ProtoStore[5])();
  if ((uVar1 == 0) && ((proto->flags & 1) == 0)) {
    std::__cxx11::string::string((string *)&local_78,"void",&local_7d);
    local_58.type = syntax;
    local_58.highlight = keyword_color;
    local_58.name = &local_78;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
  }
  else {
    uVar5 = 1;
    if (1 < (int)uVar1) {
      uVar5 = uVar1;
    }
    while (uVar5 - 1 != 0) {
      PrintLanguage::pushOp(&this->super_PrintLanguage,&comma,(PcodeOp *)0x0);
      uVar5 = uVar5 - 1;
    }
    if ((uVar1 != 0) && ((proto->flags & 1) != 0)) {
      PrintLanguage::pushOp(&this->super_PrintLanguage,&comma,(PcodeOp *)0x0);
    }
    uVar6 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = uVar1;
    }
    local_7c = uVar1;
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = (*proto->store->_vptr_ProtoStore[6])(proto->store,(ulong)uVar6);
      plVar3 = (long *)CONCAT44(extraout_var,iVar2);
      uVar4 = (**(code **)(*plVar3 + 0x18))(plVar3);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6e])(this,uVar4,1);
      std::__cxx11::string::string((string *)&local_78,"",&local_7d);
      local_58.type = blanktoken;
      local_58.highlight = no_color;
      local_58.name = &local_78;
      PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      uVar4 = (**(code **)(*plVar3 + 0x18))(plVar3);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6f])(this,uVar4);
    }
    if ((proto->flags & 1) == 0) {
      return;
    }
    if (local_7c == 0) {
      std::__cxx11::string::string((string *)&local_78,"",&local_7d);
      local_58.type = blanktoken;
      local_58.highlight = no_color;
      local_58.name = &local_78;
      PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
    }
    else {
      std::__cxx11::string::string((string *)&local_78,"...",&local_7d);
      local_58.type = syntax;
      local_58.highlight = no_color;
      local_58.name = &local_78;
      PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
    }
  }
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void PrintC::pushPrototypeInputs(const FuncProto *proto)

{
  int4 sz = proto->numParams();

  if ((sz == 0)&&(!proto->isDotdotdot()))
    pushAtom(Atom("void",syntax,EmitXml::keyword_color));
  else {
    for(int4 i=0;i<sz-1;++i)
      pushOp(&comma,(const PcodeOp *)0); // Print a comma for each parameter (above 1)
    if (proto->isDotdotdot()&&(sz!=0)) // Print comma for dotdotdot (if it is not by itself)
      pushOp(&comma,(const PcodeOp *)0);
    for(int4 i=0;i<sz;++i) {
      ProtoParameter *param = proto->getParam(i);
      pushTypeStart(param->getType(),true);
      pushAtom(Atom("",blanktoken,EmitXml::no_color));
      pushTypeEnd(param->getType());
    }
    if (proto->isDotdotdot()) {
      if (sz != 0)
	pushAtom(Atom("...",syntax,EmitXml::no_color));
      else {
	// In ANSI C, a prototype with empty parens means the parameters are unspecified (not void)
	// In C++, empty parens mean void, we use the ANSI C convention
	pushAtom(Atom("",blanktoken,EmitXml::no_color)); // An empty list of parameters
      }
    }
  }
}